

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.c
# Opt level: O0

void apx_port_create(apx_port_t *self,apx_portType_t port_type,char *name,int32_t line_number)

{
  char *local_30;
  int32_t line_number_local;
  char *name_local;
  apx_portType_t port_type_local;
  apx_port_t *self_local;
  
  if (self != (apx_port_t *)0x0) {
    self->port_type = port_type;
    self->port_id = 0xffffffff;
    self->line_number = line_number;
    if (name == (char *)0x0) {
      local_30 = (char *)0x0;
    }
    else {
      local_30 = strdup(name);
    }
    self->name = local_30;
    apx_dataSignature_create(&self->data_signature);
    self->attributes = (apx_portAttributes_t *)0x0;
    self->proper_init_value = (dtl_dv_t *)0x0;
  }
  return;
}

Assistant:

void apx_port_create(apx_port_t* self, apx_portType_t port_type, const char* name, int32_t line_number)
{
   if (self != NULL)
   {
      self->port_type = port_type;
      self->port_id = APX_INVALID_PORT_ID;
      self->line_number = line_number;
      self->name = (name != 0) ? STRDUP(name) : 0;
      apx_dataSignature_create(&self->data_signature);
      self->attributes = NULL;
      self->proper_init_value = NULL;
   }
}